

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void clear_bb_insn_dead_vars(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn)

{
  dead_var_t_conflict elem;
  dead_var_t_conflict dv;
  bb_insn_t_conflict bb_insn_local;
  gen_ctx_t gen_ctx_local;
  
  while( true ) {
    elem = DLIST_dead_var_t_head(&bb_insn->insn_dead_vars);
    if (elem == (dead_var_t_conflict)0x0) break;
    DLIST_dead_var_t_remove(&bb_insn->insn_dead_vars,elem);
    free_dead_var(gen_ctx,elem);
  }
  return;
}

Assistant:

static void clear_bb_insn_dead_vars (gen_ctx_t gen_ctx, bb_insn_t bb_insn) {
  dead_var_t dv;

  while ((dv = DLIST_HEAD (dead_var_t, bb_insn->insn_dead_vars)) != NULL) {
    DLIST_REMOVE (dead_var_t, bb_insn->insn_dead_vars, dv);
    free_dead_var (gen_ctx, dv);
  }
}